

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRalgorithm.cpp
# Opt level: O0

void Rotate(Matrix *m,int i,Rotation *r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  reference pvVar6;
  double *pdVar7;
  int local_68;
  int k;
  undefined1 local_58 [8];
  Vector lRow;
  Vector uRow;
  int n;
  Rotation *r_local;
  int i_local;
  Matrix *m_local;
  
  iVar5 = Matrix::GetCols(m);
  Matrix::GetRow((Vector *)
                 &lRow.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,m,i);
  Matrix::GetRow((Vector *)local_58,m,i + 1);
  for (local_68 = 0; local_68 < iVar5; local_68 = local_68 + 1) {
    dVar1 = r->c;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &lRow.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)local_68);
    dVar2 = *pvVar6;
    dVar3 = r->s;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,(long)local_68);
    dVar4 = *pvVar6;
    pdVar7 = Matrix::operator()(m,i,local_68);
    *pdVar7 = dVar1 * dVar2 + dVar3 * dVar4;
    dVar1 = r->s;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &lRow.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)local_68);
    dVar2 = *pvVar6;
    dVar3 = r->c;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,(long)local_68);
    dVar4 = *pvVar6;
    pdVar7 = Matrix::operator()(m,i + 1,local_68);
    *pdVar7 = dVar3 * dVar4 - dVar1 * dVar2;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_58);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &lRow.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Rotate(Matrix &m, int i, const Rotation &r)
{
    const int n = m.GetCols();

    Vector uRow = m.GetRow(i);
    Vector lRow = m.GetRow(i + 1);

    for (int k = 0; k < n; k++)
    {
        m(i, k) = r.c * uRow[k] + r.s * lRow[k];
        m(i + 1, k) = -r.s * uRow[k] + r.c * lRow[k];
    }
}